

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolve.cpp
# Opt level: O3

HighsStatus
solveUnconstrainedLp
          (HighsOptions *options,HighsLp *lp,HighsModelStatus *model_status,HighsInfo *highs_info,
          HighsSolution *solution,HighsBasis *basis)

{
  HighsInt *pHVar1;
  pointer pdVar2;
  pointer pHVar3;
  iterator iVar4;
  iterator __position;
  double dVar5;
  HighsModelStatus *pHVar6;
  bool bVar7;
  HighsBasisStatus HVar8;
  HighsInt HVar9;
  ObjSense OVar10;
  HighsModelStatus HVar11;
  HighsInt iRow;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  vector<double,_std::allocator<double>_> *pvVar17;
  value_type_conflict1 local_e0;
  undefined4 local_d8;
  uint uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  vector<double,_std::allocator<double>_> *local_c8;
  undefined8 uStack_c0;
  vector<double,_std::allocator<double>_> *local_b0;
  double local_a8;
  HighsModelStatus *local_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  
  resetModelStatusAndHighsInfo(model_status,highs_info);
  if ((0 < lp->num_row_) && (HVar9 = HighsSparseMatrix::numNz(&lp->a_matrix_), 0 < HVar9)) {
    return kError;
  }
  local_a0 = model_status;
  highsLogUser(&(options->super_HighsOptionsStruct).log_options,kInfo,
               "Solving an unconstrained LP with %d columns\n",(ulong)(uint)lp->num_col_);
  local_50 = &solution->col_value;
  local_e0 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (local_50,(long)lp->num_col_,&local_e0);
  local_58 = &solution->col_dual;
  local_e0 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (local_58,(long)lp->num_col_,&local_e0);
  local_60 = &basis->col_status;
  local_e0 = (value_type_conflict1)CONCAT71(local_e0._1_7_,4);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::_M_fill_assign
            (local_60,(long)lp->num_col_,(value_type *)&local_e0);
  pdVar2 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  pdVar2 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  pHVar3 = (basis->row_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((basis->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_finish != pHVar3) {
    (basis->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar3;
  }
  local_88 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  uStack_80 = 0;
  local_78 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  uStack_70 = 0;
  local_a8 = lp->offset_;
  (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = 0;
  (highs_info->super_HighsInfoStruct).max_primal_infeasibility = 0.0;
  (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = 0.0;
  (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = 0;
  (highs_info->super_HighsInfoStruct).max_dual_infeasibility = 0.0;
  (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = 0.0;
  if (0 < lp->num_row_) {
    local_b0 = &solution->row_value;
    local_c8 = &solution->row_dual;
    local_98._0_8_ = &basis->row_status;
    local_88._4_4_ = (uint)((ulong)local_88 >> 0x20);
    uStack_d4 = local_88._4_4_ ^ 0x80000000;
    uStack_d0 = 0;
    uStack_cc = 0x80000000;
    local_d8 = (undefined4)local_88;
    lVar12 = 0;
    do {
      dVar15 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      if (dVar15 <= local_88) {
        dVar16 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
        dVar15 = 0.0;
        if (dVar16 < (double)CONCAT44(uStack_d4,local_d8)) {
          dVar15 = -dVar16;
        }
      }
      local_e0 = 0.0;
      iVar4._M_current =
           (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_b0,iVar4,&local_e0);
      }
      else {
        *iVar4._M_current = 0.0;
        (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      local_e0 = 0.0;
      iVar4._M_current =
           (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_c8,iVar4,&local_e0);
      }
      else {
        *iVar4._M_current = 0.0;
        (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      local_e0 = (value_type_conflict1)CONCAT71(local_e0._1_7_,1);
      __position._M_current =
           (basis->row_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (basis->row_status).
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
        _M_realloc_insert<HighsBasisStatus>
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)local_98._0_8_,
                   __position,(HighsBasisStatus *)&local_e0);
      }
      else {
        *__position._M_current = kBasic;
        (basis->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (local_88 < dVar15) {
        pHVar1 = &(highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
        *pHVar1 = *pHVar1 + 1;
      }
      (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities =
           (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities + dVar15;
      dVar16 = (highs_info->super_HighsInfoStruct).max_primal_infeasibility;
      uVar13 = SUB84(dVar16,0);
      uVar14 = (undefined4)((ulong)dVar16 >> 0x20);
      if (dVar16 <= dVar15) {
        uVar13 = SUB84(dVar15,0);
        uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
      }
      (highs_info->super_HighsInfoStruct).max_primal_infeasibility = (double)CONCAT44(uVar14,uVar13)
      ;
      lVar12 = lVar12 + 1;
    } while (lVar12 < lp->num_row_);
  }
  pHVar6 = local_a0;
  if (0 < lp->num_col_) {
    uStack_44 = local_78._4_4_ ^ 0x80000000;
    uStack_3c = (uint)((ulong)uStack_70 >> 0x20) ^ 0x80000000;
    uStack_40 = (undefined4)uStack_70;
    local_48 = (undefined4)local_78;
    OVar10 = lp->sense_;
    lVar12 = 0;
    do {
      local_b0 = (vector<double,_std::allocator<double>_> *)
                 (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
      dVar16 = (double)OVar10 * (double)local_b0;
      local_c8 = (vector<double,_std::allocator<double>_> *)
                 (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
      dVar15 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      local_d8 = SUB84(dVar15,0);
      uStack_d4 = (uint)((ulong)dVar15 >> 0x20);
      uStack_d0 = 0;
      uStack_cc = 0;
      uStack_c0 = 0;
      if ((double)local_c8 <= dVar15) {
        dVar15 = (double)((ulong)local_c8 ^ (ulong)DAT_003be0d0);
        local_98._8_4_ = DAT_003be0d0._8_4_;
        local_98._0_8_ = dVar15;
        local_98._12_4_ = DAT_003be0d0._12_4_;
        bVar7 = highs_isInfinity(dVar15);
        if ((bVar7) && (bVar7 = highs_isInfinity((double)CONCAT44(uStack_d4,local_d8)), bVar7)) {
          dVar15 = ABS(dVar16);
          HVar8 = kZero;
          dVar5 = 0.0;
          pvVar17 = (vector<double,_std::allocator<double>_> *)0x0;
        }
        else if (local_78 <= dVar16) {
          bVar7 = highs_isInfinity((double)local_98._0_8_);
          dVar5 = 0.0;
          dVar15 = dVar16;
          if (bVar7) {
LAB_002597cd:
            HVar8 = kUpper;
            dVar5 = 0.0;
            pvVar17 = (vector<double,_std::allocator<double>_> *)CONCAT44(uStack_d4,local_d8);
          }
          else {
            HVar8 = kLower;
            dVar15 = 0.0;
            pvVar17 = local_c8;
          }
        }
        else if (dVar16 <= (double)CONCAT44(uStack_44,local_48)) {
          bVar7 = highs_isInfinity((double)CONCAT44(uStack_d4,local_d8));
          dVar5 = 0.0;
          if (!bVar7) {
            dVar15 = 0.0;
            goto LAB_002597cd;
          }
          dVar15 = -dVar16;
          HVar8 = kLower;
          pvVar17 = local_c8;
        }
        else {
          bVar7 = highs_isInfinity((double)local_98._0_8_);
          pvVar17 = (vector<double,_std::allocator<double>_> *)CONCAT44(uStack_d4,local_d8);
          if (!bVar7) {
            pvVar17 = local_c8;
          }
          HVar8 = bVar7 * '\x02';
          dVar15 = ABS(dVar16);
          dVar5 = 0.0;
        }
      }
      else {
        bVar7 = highs_isInfinity((double)local_c8);
        if (bVar7) {
          bVar7 = highs_isInfinity(-(double)CONCAT44(uStack_d4,local_d8));
          if (bVar7) {
            dVar15 = ABS(dVar16);
            HVar8 = kZero;
            dVar5 = INFINITY;
            pvVar17 = (vector<double,_std::allocator<double>_> *)0x0;
          }
          else {
            dVar5 = (double)local_c8 - (double)CONCAT44(uStack_d4,local_d8);
            dVar15 = 0.0;
            if (0.0 <= dVar16) {
              dVar15 = dVar16;
            }
            HVar8 = kUpper;
            pvVar17 = (vector<double,_std::allocator<double>_> *)CONCAT44(uStack_d4,local_d8);
          }
        }
        else {
          dVar5 = (double)local_c8 - (double)CONCAT44(uStack_d4,local_d8);
          uVar14 = 0;
          uVar13 = 0;
          if (0.0 <= -dVar16) {
            uVar14 = (undefined4)((ulong)-dVar16 >> 0x20);
            uVar13 = SUB84(dVar16,0);
          }
          dVar15 = (double)CONCAT44(uVar14,uVar13);
          HVar8 = kLower;
          pvVar17 = local_c8;
        }
      }
      (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar12] = (double)pvVar17;
      OVar10 = lp->sense_;
      (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar12] = dVar16 * (double)OVar10;
      (local_60->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar12] = HVar8;
      if (local_88 < dVar5) {
        pHVar1 = &(highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
        *pHVar1 = *pHVar1 + 1;
      }
      (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities =
           (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities + dVar5;
      dVar16 = (highs_info->super_HighsInfoStruct).max_primal_infeasibility;
      if (dVar16 <= dVar5) {
        dVar16 = dVar5;
      }
      (highs_info->super_HighsInfoStruct).max_primal_infeasibility = dVar16;
      if (local_78 < dVar15) {
        pHVar1 = &(highs_info->super_HighsInfoStruct).num_dual_infeasibilities;
        *pHVar1 = *pHVar1 + 1;
      }
      local_a8 = local_a8 + (double)pvVar17 * (double)local_b0;
      (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities =
           (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities + dVar15;
      dVar16 = (highs_info->super_HighsInfoStruct).max_dual_infeasibility;
      if (dVar16 <= dVar15) {
        dVar16 = dVar15;
      }
      (highs_info->super_HighsInfoStruct).max_dual_infeasibility = dVar16;
      lVar12 = lVar12 + 1;
    } while (lVar12 < lp->num_col_);
  }
  (highs_info->super_HighsInfoStruct).objective_function_value = local_a8;
  solution->value_valid = true;
  solution->dual_valid = true;
  basis->valid = true;
  basis->useful = true;
  (highs_info->super_HighsInfoStruct).basis_validity = 1;
  setSolutionStatus(highs_info);
  HVar11 = kInfeasible;
  if ((highs_info->super_HighsInfoStruct).num_primal_infeasibilities == 0) {
    HVar11 = (uint)((highs_info->super_HighsInfoStruct).num_dual_infeasibilities != 0) * 3 +
             kOptimal;
  }
  *pHVar6 = HVar11;
  return kOk;
}

Assistant:

HighsStatus solveUnconstrainedLp(const HighsOptions& options, const HighsLp& lp,
                                 HighsModelStatus& model_status,
                                 HighsInfo& highs_info, HighsSolution& solution,
                                 HighsBasis& basis) {
  // Aliase to model status and solution parameters
  resetModelStatusAndHighsInfo(model_status, highs_info);

  // Check that the LP really is unconstrained!
  assert(lp.num_row_ == 0 || lp.a_matrix_.numNz() == 0);
  if (lp.num_row_ > 0) {
    // LP has rows, but should only be here if the constraint matrix
    // is zero
    if (lp.a_matrix_.numNz() > 0) return HighsStatus::kError;
  }

  highsLogUser(options.log_options, HighsLogType::kInfo,
               "Solving an unconstrained LP with %" HIGHSINT_FORMAT
               " columns\n",
               lp.num_col_);
  solution.col_value.assign(lp.num_col_, 0);
  solution.col_dual.assign(lp.num_col_, 0);
  basis.col_status.assign(lp.num_col_, HighsBasisStatus::kNonbasic);
  // No rows for primal solution, dual solution or basis
  solution.row_value.clear();
  solution.row_dual.clear();
  basis.row_status.clear();

  double primal_feasibility_tolerance = options.primal_feasibility_tolerance;
  double dual_feasibility_tolerance = options.dual_feasibility_tolerance;

  // Initialise the objective value calculation. Done using
  // HighsSolution so offset is vanilla
  double objective = lp.offset_;

  highs_info.num_primal_infeasibilities = 0;
  highs_info.max_primal_infeasibility = 0;
  highs_info.sum_primal_infeasibilities = 0;
  highs_info.num_dual_infeasibilities = 0;
  highs_info.max_dual_infeasibility = 0;
  highs_info.sum_dual_infeasibilities = 0;

  if (lp.num_row_ > 0) {
    // Assign primal, dual and basis status for rows, checking for
    // infeasibility
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
      double primal_infeasibility = 0;
      double lower = lp.row_lower_[iRow];
      double upper = lp.row_upper_[iRow];
      if (lower > primal_feasibility_tolerance) {
        // Lower bound too large for zero activity
        primal_infeasibility = lower;
      } else if (upper < -primal_feasibility_tolerance) {
        // Upper bound too small for zero activity
        primal_infeasibility = -upper;
      }
      solution.row_value.push_back(0);
      solution.row_dual.push_back(0);
      basis.row_status.push_back(HighsBasisStatus::kBasic);
      if (primal_infeasibility > primal_feasibility_tolerance)
        highs_info.num_primal_infeasibilities++;
      highs_info.sum_primal_infeasibilities += primal_infeasibility;
      highs_info.max_primal_infeasibility =
          std::max(primal_infeasibility, highs_info.max_primal_infeasibility);
    }
  }

  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double cost = lp.col_cost_[iCol];
    double dual = (HighsInt)lp.sense_ * cost;
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    double value;
    double primal_infeasibility = 0;
    double dual_infeasibility = -1;
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower > upper) {
      // Inconsistent bounds, so set the variable to lower bound,
      // unless it's infinite. Otherwise set the variable to upper
      // bound, unless it's infinite. Otherwise set the variable to
      // zero.
      if (highs_isInfinity(lower)) {
        // Lower bound of +inf
        if (highs_isInfinity(-upper)) {
          // Upper bound of -inf
          value = 0;
          status = HighsBasisStatus::kZero;
          primal_infeasibility = kHighsInf;
          dual_infeasibility = std::fabs(dual);
        } else {
          // Finite upper bound - since lower exceeds it
          value = upper;
          status = HighsBasisStatus::kUpper;
          primal_infeasibility = lower - value;
          dual_infeasibility = std::max(dual, 0.);
        }
      } else {
        // Finite lower bound
        value = lower;
        status = HighsBasisStatus::kLower;
        primal_infeasibility = value - upper;
        dual_infeasibility = std::max(-dual, 0.);
      }
    } else if (highs_isInfinity(-lower) && highs_isInfinity(upper)) {
      // Free column: set to zero and record dual infeasibility
      value = 0;
      status = HighsBasisStatus::kZero;
      dual_infeasibility = std::fabs(dual);
    } else if (dual >= dual_feasibility_tolerance) {
      // Column with sufficiently positive dual
      if (!highs_isInfinity(-lower)) {
        // Set to this finite lower bound
        value = lower;
        status = HighsBasisStatus::kLower;
        dual_infeasibility = 0;
      } else {
        // Infinite lower bound so set to upper bound and record dual
        // infeasibility
        value = upper;
        status = HighsBasisStatus::kUpper;
        dual_infeasibility = dual;
      }
    } else if (dual <= -dual_feasibility_tolerance) {
      // Column with sufficiently negative dual
      if (!highs_isInfinity(upper)) {
        // Set to this finite upper bound
        value = upper;
        status = HighsBasisStatus::kUpper;
        dual_infeasibility = 0;
      } else {
        // Infinite upper bound so set to lower bound and record dual
        // infeasibility
        value = lower;
        status = HighsBasisStatus::kLower;
        dual_infeasibility = -dual;
      }
    } else {
      // Column with sufficiently small dual: set to lower bound (if
      // finite) otherwise upper bound
      if (highs_isInfinity(-lower)) {
        value = upper;
        status = HighsBasisStatus::kUpper;
      } else {
        value = lower;
        status = HighsBasisStatus::kLower;
      }
      dual_infeasibility = std::fabs(dual);
    }
    assert(status != HighsBasisStatus::kNonbasic);
    assert(dual_infeasibility >= 0);
    solution.col_value[iCol] = value;
    solution.col_dual[iCol] = (HighsInt)lp.sense_ * dual;
    basis.col_status[iCol] = status;
    objective += value * cost;
    if (primal_infeasibility > primal_feasibility_tolerance)
      highs_info.num_primal_infeasibilities++;
    highs_info.sum_primal_infeasibilities += primal_infeasibility;
    highs_info.max_primal_infeasibility =
        std::max(primal_infeasibility, highs_info.max_primal_infeasibility);
    if (dual_infeasibility > dual_feasibility_tolerance)
      highs_info.num_dual_infeasibilities++;
    highs_info.sum_dual_infeasibilities += dual_infeasibility;
    highs_info.max_dual_infeasibility =
        std::max(dual_infeasibility, highs_info.max_dual_infeasibility);
  }
  highs_info.objective_function_value = objective;
  solution.value_valid = true;
  solution.dual_valid = true;
  basis.valid = true;
  basis.useful = true;
  highs_info.basis_validity = kBasisValidityValid;
  setSolutionStatus(highs_info);
  if (highs_info.num_primal_infeasibilities) {
    // Primal infeasible
    model_status = HighsModelStatus::kInfeasible;
  } else if (highs_info.num_dual_infeasibilities) {
    // Dual infeasible => primal unbounded for unconstrained LP
    model_status = HighsModelStatus::kUnbounded;
  } else {
    model_status = HighsModelStatus::kOptimal;
  }

  return HighsStatus::kOk;
}